

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffm_score.cc
# Opt level: O0

void __thiscall
xLearn::FFMScore::calc_grad_ftrl(FFMScore *this,SparseRow *row,Model *model,real_t pg,real_t norm)

{
  real_t rVar1;
  float fVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  real_t *prVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  bool bVar22;
  index_t iVar23;
  pointer pNVar24;
  real_t *prVar25;
  real_t *prVar26;
  undefined1 (*pauVar27) [16];
  undefined1 (*pauVar28) [16];
  real_t *prVar29;
  real_t *prVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  int iVar35;
  Model *in_RDX;
  long in_RDI;
  float in_XMM0_Da;
  float fVar36;
  double dVar37;
  double dVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float in_XMM1_Da;
  real_t z2_value;
  int sign_2;
  real_t z1_value;
  size_t i;
  __m128 XMMsigma2;
  __m128 XMMsigma1;
  __m128 XMMg2;
  __m128 XMMg1;
  __m128 XMMz2;
  __m128 XMMz1;
  __m128 XMMwg2;
  __m128 XMMwg1;
  __m128 XMMw2;
  __m128 XMMw1;
  real_t *z2;
  real_t *z1;
  real_t *wg2;
  real_t *wg1;
  real_t *w2;
  real_t *w1;
  index_t d;
  __m128 XMMpgv;
  __m128 XMMv;
  real_t *w2_base;
  real_t *w1_base;
  real_t v2;
  index_t f2;
  index_t j2;
  const_iterator iter_j;
  real_t v1;
  index_t f1;
  index_t j1;
  const_iterator iter_i;
  __m128 XMML2;
  __m128 XMMalpha;
  __m128 XMMpg;
  index_t align;
  index_t align1;
  index_t align0;
  int sign;
  real_t sigma;
  real_t old_wbg;
  real_t g;
  real_t *wbz;
  real_t *wbg;
  real_t *wb;
  int sign_1;
  real_t sigma_1;
  real_t old_wlg;
  real_t g_1;
  real_t *wlz;
  real_t *wlg;
  real_t *wl;
  index_t feat_id;
  const_iterator iter;
  index_t num_field;
  index_t num_feat;
  real_t *w;
  real_t sqrt_norm;
  vector<xLearn::Node,_std::allocator<xLearn::Node>_> *in_stack_fffffffffffff8d8;
  undefined4 in_stack_fffffffffffff8e0;
  float in_stack_fffffffffffff8e4;
  float in_stack_fffffffffffff8e8;
  float in_stack_fffffffffffff8ec;
  ulong local_6d0;
  undefined8 local_6c8;
  undefined8 uStack_6c0;
  undefined8 local_6b8;
  undefined8 uStack_6b0;
  undefined8 local_688;
  undefined8 uStack_680;
  undefined8 local_678;
  undefined8 uStack_670;
  undefined8 local_668;
  undefined8 uStack_660;
  undefined8 local_658;
  undefined8 uStack_650;
  uint local_5ec;
  __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
  local_5a0;
  real_t local_594;
  uint local_590;
  uint local_58c;
  Node *local_588;
  __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
  local_580;
  undefined8 local_578;
  undefined8 uStack_570;
  undefined8 local_568;
  undefined8 uStack_560;
  undefined8 local_558;
  undefined8 uStack_550;
  int local_544;
  int local_540;
  uint local_53c;
  int local_538;
  float local_534;
  real_t local_530;
  float local_52c;
  float *local_528;
  real_t *local_520;
  real_t *local_518;
  int local_510;
  float local_50c;
  real_t local_508;
  uint local_504;
  float *local_500;
  real_t *local_4f8;
  real_t *local_4f0;
  uint local_4e4;
  Node *local_4e0;
  __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
  local_4d8;
  index_t local_4d0;
  index_t local_4cc;
  real_t *local_4c8;
  float local_4bc;
  float local_4b8;
  float local_4b4;
  Model *local_4b0;
  float local_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float local_47c;
  undefined4 local_478;
  undefined4 uStack_474;
  undefined4 uStack_470;
  undefined4 uStack_46c;
  undefined4 local_45c;
  undefined4 local_458;
  undefined4 uStack_454;
  undefined4 uStack_450;
  undefined4 uStack_44c;
  undefined4 local_43c;
  float local_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float local_41c;
  real_t *local_418;
  real_t *local_410;
  undefined1 (*local_408) [16];
  undefined1 (*local_400) [16];
  real_t *local_3f8;
  real_t *local_3f0;
  float local_3e8;
  float fStack_3e4;
  float fStack_3e0;
  float fStack_3dc;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  float local_3c8;
  float fStack_3c4;
  float fStack_3c0;
  float fStack_3bc;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined1 local_3a8 [8];
  float fStack_3a0;
  float fStack_39c;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined1 local_388 [8];
  float fStack_380;
  float fStack_37c;
  undefined8 local_378;
  undefined8 uStack_370;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  undefined8 local_358;
  undefined8 uStack_350;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  undefined8 local_338;
  undefined8 uStack_330;
  float local_328;
  float fStack_324;
  float fStack_320;
  float fStack_31c;
  float local_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float local_308;
  float fStack_304;
  float fStack_300;
  float fStack_2fc;
  float local_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined1 local_2d8 [16];
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  undefined8 local_178;
  undefined8 uStack_170;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined8 local_108;
  undefined8 uStack_100;
  undefined1 (*local_f0) [16];
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined1 (*local_d0) [16];
  undefined8 local_c8;
  undefined8 uStack_c0;
  real_t *local_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  real_t *local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined1 local_78 [16];
  undefined8 local_68;
  undefined8 uStack_60;
  undefined1 local_58 [16];
  undefined8 local_48;
  undefined8 uStack_40;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  undefined8 local_28;
  undefined8 uStack_20;
  float local_18;
  float fStack_14;
  float fStack_10;
  float fStack_c;
  
  local_4b8 = in_XMM1_Da;
  local_4b4 = in_XMM0_Da;
  local_4b0 = in_RDX;
  dVar37 = std::sqrt((double)(ulong)(uint)in_XMM1_Da);
  local_4bc = SUB84(dVar37,0);
  local_4c8 = Model::GetParameter_w(local_4b0);
  local_4cc = Model::GetNumFeature(local_4b0);
  local_4d0 = Model::GetNumField(local_4b0);
  local_4d8._M_current =
       (Node *)std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::begin
                         (in_stack_fffffffffffff8d8);
  while( true ) {
    local_4e0 = (Node *)std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::end
                                  (in_stack_fffffffffffff8d8);
    bVar22 = __gnu_cxx::operator!=
                       ((__normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
                         *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0),
                        (__normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
                         *)in_stack_fffffffffffff8d8);
    if (!bVar22) break;
    pNVar24 = __gnu_cxx::
              __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
              ::operator->(&local_4d8);
    fVar36 = local_4b4;
    local_4e4 = pNVar24->feat_id;
    if (local_4e4 < local_4cc) {
      local_4f0 = local_4c8 + local_4e4 * 3;
      local_4f8 = local_4c8 + (local_4e4 * 3 + 1);
      local_500 = local_4c8 + (local_4e4 * 3 + 2);
      uVar33 = *(uint *)(in_RDI + 0x1c);
      rVar1 = *local_4f0;
      pNVar24 = __gnu_cxx::
                __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
                ::operator->(&local_4d8);
      auVar4 = vfmadd213ss_fma(ZEXT416((uint)rVar1),ZEXT416(uVar33),
                               ZEXT416((uint)(fVar36 * pNVar24->feat_val * local_4bc)));
      local_504 = auVar4._0_4_;
      local_508 = *local_4f8;
      auVar4 = vfmadd213ss_fma(ZEXT416(local_504),ZEXT416(local_504),ZEXT416((uint)*local_4f8));
      *local_4f8 = auVar4._0_4_;
      dVar37 = std::sqrt((double)(ulong)(uint)*local_4f8);
      dVar38 = std::sqrt((double)(ulong)(uint)local_508);
      local_50c = (SUB84(dVar37,0) - SUB84(dVar38,0)) / *(float *)(in_RDI + 0x10);
      auVar4 = vfmadd213ss_fma(ZEXT416((uint)*local_4f0),ZEXT416((uint)-local_50c),
                               ZEXT416(local_504));
      *local_500 = auVar4._0_4_ + *local_500;
      local_510 = -1;
      if (0.0 < *local_500) {
        local_510 = 1;
      }
      if (*(float *)(in_RDI + 0x18) < (float)local_510 * *local_500) {
        auVar4 = vfmadd213ss_fma(ZEXT416(*(uint *)(in_RDI + 0x18)),ZEXT416((uint)(float)local_510),
                                 ZEXT416((uint)-*local_500));
        fVar36 = *(float *)(in_RDI + 0x14);
        dVar37 = std::sqrt((double)(ulong)(uint)*local_4f8);
        *local_4f0 = auVar4._0_4_ /
                     ((fVar36 + SUB84(dVar37,0)) / *(float *)(in_RDI + 0x10) +
                     *(float *)(in_RDI + 0x1c));
      }
      else {
        *local_4f0 = 0.0;
      }
    }
    __gnu_cxx::
    __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
    ::operator++(&local_4d8);
  }
  local_518 = Model::GetParameter_b(local_4b0);
  local_520 = local_518 + 1;
  local_528 = local_518 + 2;
  local_52c = local_4b4;
  local_530 = *local_520;
  auVar4 = vfmadd213ss_fma(ZEXT416((uint)local_4b4),ZEXT416((uint)local_4b4),
                           ZEXT416((uint)*local_520));
  *local_520 = auVar4._0_4_;
  local_4c8 = local_518;
  dVar37 = std::sqrt((double)(ulong)(uint)*local_520);
  dVar38 = std::sqrt((double)(ulong)(uint)local_530);
  local_534 = (SUB84(dVar37,0) - SUB84(dVar38,0)) / *(float *)(in_RDI + 0x10);
  auVar4 = vfmadd213ss_fma(ZEXT416((uint)*local_518),ZEXT416((uint)-local_534),
                           ZEXT416((uint)local_52c));
  *local_528 = auVar4._0_4_ + *local_528;
  local_538 = -1;
  if (0.0 < *local_528) {
    local_538 = 1;
  }
  if (*(float *)(in_RDI + 0x18) < (float)local_538 * *local_528) {
    auVar4 = vfmadd213ss_fma(ZEXT416(*(uint *)(in_RDI + 0x18)),ZEXT416((uint)(float)local_538),
                             ZEXT416((uint)-*local_528));
    fVar36 = *(float *)(in_RDI + 0x14);
    dVar37 = std::sqrt((double)(ulong)(uint)*local_520);
    *local_518 = auVar4._0_4_ /
                 ((fVar36 + SUB84(dVar37,0)) / *(float *)(in_RDI + 0x10) + *(float *)(in_RDI + 0x1c)
                 );
  }
  else {
    *local_518 = 0.0;
  }
  iVar23 = Model::get_aligned_k((Model *)0x204e49);
  local_53c = iVar23 * 3;
  iVar23 = Model::GetNumField(local_4b0);
  local_540 = iVar23 * local_53c;
  local_544 = 0xc;
  local_4c8 = Model::GetParameter_v(local_4b0);
  local_41c = local_4b4;
  local_438 = local_4b4;
  fStack_434 = local_4b4;
  fStack_430 = local_4b4;
  fStack_42c = local_4b4;
  local_558 = CONCAT44(local_4b4,local_4b4);
  uStack_550 = CONCAT44(local_4b4,local_4b4);
  local_458 = *(undefined4 *)(in_RDI + 0x10);
  local_568 = CONCAT44(local_458,local_458);
  uStack_560 = CONCAT44(local_458,local_458);
  local_478 = *(undefined4 *)(in_RDI + 0x1c);
  local_578 = CONCAT44(local_478,local_478);
  uStack_570 = CONCAT44(local_478,local_478);
  uStack_474 = local_478;
  uStack_470 = local_478;
  uStack_46c = local_478;
  local_45c = local_478;
  uStack_454 = local_458;
  uStack_450 = local_458;
  uStack_44c = local_458;
  local_43c = local_458;
  local_580._M_current =
       (Node *)std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::begin
                         (in_stack_fffffffffffff8d8);
  while( true ) {
    local_588 = (Node *)std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::end
                                  (in_stack_fffffffffffff8d8);
    bVar22 = __gnu_cxx::operator!=
                       ((__normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
                         *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0),
                        (__normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
                         *)in_stack_fffffffffffff8d8);
    if (!bVar22) break;
    pNVar24 = __gnu_cxx::
              __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
              ::operator->(&local_580);
    local_58c = pNVar24->feat_id;
    pNVar24 = __gnu_cxx::
              __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
              ::operator->(&local_580);
    local_590 = pNVar24->field_id;
    if ((local_58c < local_4cc) && (local_590 < local_4d0)) {
      pNVar24 = __gnu_cxx::
                __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
                ::operator->(&local_580);
      local_594 = pNVar24->feat_val;
      local_5a0 = __gnu_cxx::
                  __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
                  ::operator+((__normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
                               *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
                              CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0));
      while( true ) {
        std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::end(in_stack_fffffffffffff8d8);
        bVar22 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
                             *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0),
                            (__normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
                             *)in_stack_fffffffffffff8d8);
        if (!bVar22) break;
        pNVar24 = __gnu_cxx::
                  __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
                  ::operator->(&local_5a0);
        uVar33 = pNVar24->feat_id;
        pNVar24 = __gnu_cxx::
                  __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
                  ::operator->(&local_5a0);
        uVar32 = pNVar24->field_id;
        if ((uVar33 < local_4cc) && (uVar32 < local_4d0)) {
          pNVar24 = __gnu_cxx::
                    __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
                    ::operator->(&local_5a0);
          prVar15 = local_4c8;
          uVar31 = local_58c * local_540;
          uVar32 = uVar32 * local_53c;
          uVar33 = uVar33 * local_540;
          uVar34 = local_590 * local_53c;
          local_498 = local_594 * pNVar24->feat_val * local_4b8;
          local_198 = CONCAT44(local_498,local_498);
          uStack_190 = CONCAT44(local_498,local_498);
          local_1a8 = local_558;
          uVar5 = local_1a8;
          uStack_1a0 = uStack_550;
          uVar6 = uStack_1a0;
          local_1a8._0_4_ = (float)local_558;
          local_1a8._4_4_ = (float)((ulong)local_558 >> 0x20);
          uStack_1a0._0_4_ = (float)uStack_550;
          uStack_1a0._4_4_ = (float)((ulong)uStack_550 >> 0x20);
          fVar36 = local_498 * (float)local_1a8;
          fVar39 = local_498 * local_1a8._4_4_;
          fVar40 = local_498 * (float)uStack_1a0;
          fVar41 = local_498 * uStack_1a0._4_4_;
          fStack_494 = local_498;
          fStack_490 = local_498;
          fStack_48c = local_498;
          local_47c = local_498;
          local_1a8 = uVar5;
          uStack_1a0 = uVar6;
          for (local_5ec = 0; local_5ec < local_53c; local_5ec = local_544 + local_5ec) {
            prVar25 = prVar15 + (ulong)uVar31 + (ulong)uVar32 + (ulong)local_5ec;
            prVar26 = prVar15 + (ulong)uVar33 + (ulong)uVar34 + (ulong)local_5ec;
            pauVar27 = (undefined1 (*) [16])(prVar25 + 4);
            pauVar28 = (undefined1 (*) [16])(prVar26 + 4);
            prVar29 = prVar25 + 8;
            prVar30 = prVar26 + 8;
            local_288 = *(undefined8 *)prVar25;
            uStack_280 = *(undefined8 *)(prVar25 + 2);
            local_2a8 = *(undefined8 *)prVar26;
            uStack_2a0 = *(undefined8 *)(prVar26 + 2);
            local_3b8 = *(undefined8 *)*pauVar27;
            uStack_3b0 = *(undefined8 *)(prVar25 + 6);
            local_3d8 = *(undefined8 *)*pauVar28;
            uStack_3d0 = *(undefined8 *)(prVar26 + 6);
            uVar5 = *(undefined8 *)prVar29;
            uVar6 = *(undefined8 *)(prVar25 + 10);
            uVar7 = *(undefined8 *)prVar30;
            uVar8 = *(undefined8 *)(prVar26 + 10);
            local_1b8 = local_578;
            uVar20 = local_1b8;
            uStack_1b0 = uStack_570;
            uVar21 = uStack_1b0;
            local_1b8._0_4_ = (float)local_578;
            local_1b8._4_4_ = (float)((ulong)local_578 >> 0x20);
            uStack_1b0._0_4_ = (float)uStack_570;
            uStack_1b0._4_4_ = (float)((ulong)uStack_570 >> 0x20);
            local_1c8._0_4_ = (float)local_288;
            local_1c8._4_4_ = (float)((ulong)local_288 >> 0x20);
            uStack_1c0._0_4_ = (float)uStack_280;
            uStack_1c0._4_4_ = (float)((ulong)uStack_280 >> 0x20);
            local_2f8 = (float)local_1b8 * (float)local_1c8;
            fStack_2f4 = local_1b8._4_4_ * local_1c8._4_4_;
            fStack_2f0 = (float)uStack_1b0 * (float)uStack_1c0;
            fStack_2ec = uStack_1b0._4_4_ * uStack_1c0._4_4_;
            local_1d8 = CONCAT44(fVar39,fVar36);
            uStack_1d0 = CONCAT44(fVar41,fVar40);
            local_1e8._0_4_ = (float)local_2a8;
            local_1e8._4_4_ = (float)((ulong)local_2a8 >> 0x20);
            uStack_1e0._0_4_ = (float)uStack_2a0;
            uStack_1e0._4_4_ = (float)((ulong)uStack_2a0 >> 0x20);
            local_308 = fVar36 * (float)local_1e8;
            fStack_304 = fVar39 * local_1e8._4_4_;
            fStack_300 = fVar40 * (float)uStack_1e0;
            fStack_2fc = fVar41 * uStack_1e0._4_4_;
            local_3c8 = local_2f8 + local_308;
            fStack_3c4 = fStack_2f4 + fStack_304;
            fStack_3c0 = fStack_2f0 + fStack_300;
            fStack_3bc = fStack_2ec + fStack_2fc;
            local_1f8 = local_578;
            uStack_1f0 = uStack_570;
            local_318 = (float)local_1b8 * (float)local_1e8;
            fStack_314 = local_1b8._4_4_ * local_1e8._4_4_;
            fStack_310 = (float)uStack_1b0 * (float)uStack_1e0;
            fStack_30c = uStack_1b0._4_4_ * uStack_1e0._4_4_;
            local_218 = CONCAT44(fVar39,fVar36);
            uStack_210 = CONCAT44(fVar41,fVar40);
            local_328 = fVar36 * (float)local_1c8;
            fStack_324 = fVar39 * local_1c8._4_4_;
            fStack_320 = fVar40 * (float)uStack_1c0;
            fStack_31c = fVar41 * uStack_1c0._4_4_;
            local_3e8 = local_318 + local_328;
            fStack_3e4 = fStack_314 + fStack_324;
            fStack_3e0 = fStack_310 + fStack_320;
            fStack_3dc = fStack_30c + fStack_31c;
            local_238 = CONCAT44(fStack_3c4,local_3c8);
            uStack_230 = CONCAT44(fStack_3bc,fStack_3c0);
            local_248 = CONCAT44(fStack_3c4,local_3c8);
            uStack_240 = CONCAT44(fStack_3bc,fStack_3c0);
            local_348 = local_3c8 * local_3c8;
            fStack_344 = fStack_3c4 * fStack_3c4;
            fStack_340 = fStack_3c0 * fStack_3c0;
            fStack_33c = fStack_3bc * fStack_3bc;
            local_338._0_4_ = (float)local_3b8;
            local_338._4_4_ = (float)((ulong)local_3b8 >> 0x20);
            uStack_330._0_4_ = (float)uStack_3b0;
            uStack_330._4_4_ = (float)((ulong)uStack_3b0 >> 0x20);
            local_18 = (float)local_338 + local_348;
            fStack_14 = local_338._4_4_ + fStack_344;
            fStack_10 = (float)uStack_330 + fStack_340;
            fStack_c = uStack_330._4_4_ + fStack_33c;
            auVar14._4_4_ = fStack_14;
            auVar14._0_4_ = local_18;
            auVar14._8_4_ = fStack_10;
            auVar14._12_4_ = fStack_c;
            local_118 = vsqrtps_avx(auVar14);
            local_128 = vsqrtps_avx(*pauVar27);
            local_58 = vsubps_avx(local_118,local_128);
            local_68 = local_568;
            uStack_60 = uStack_560;
            auVar12._8_8_ = uStack_560;
            auVar12._0_8_ = local_568;
            auVar4 = vdivps_avx(local_58,auVar12);
            local_258 = CONCAT44(fStack_3e4,local_3e8);
            uStack_250 = CONCAT44(fStack_3dc,fStack_3e0);
            local_268 = CONCAT44(fStack_3e4,local_3e8);
            uStack_260 = CONCAT44(fStack_3dc,fStack_3e0);
            local_368 = local_3e8 * local_3e8;
            fStack_364 = fStack_3e4 * fStack_3e4;
            fStack_360 = fStack_3e0 * fStack_3e0;
            fStack_35c = fStack_3dc * fStack_3dc;
            local_358._0_4_ = (float)local_3d8;
            local_358._4_4_ = (float)((ulong)local_3d8 >> 0x20);
            uStack_350._0_4_ = (float)uStack_3d0;
            uStack_350._4_4_ = (float)((ulong)uStack_3d0 >> 0x20);
            local_38 = (float)local_358 + local_368;
            fStack_34 = local_358._4_4_ + fStack_364;
            fStack_30 = (float)uStack_350 + fStack_360;
            fStack_2c = uStack_350._4_4_ + fStack_35c;
            auVar13._4_4_ = fStack_34;
            auVar13._0_4_ = local_38;
            auVar13._8_4_ = fStack_30;
            auVar13._12_4_ = fStack_2c;
            local_138 = vsqrtps_avx(auVar13);
            local_148 = vsqrtps_avx(*pauVar28);
            local_78 = vsubps_avx(local_138,local_148);
            local_88 = local_568;
            uStack_80 = uStack_560;
            auVar11._8_8_ = uStack_560;
            auVar11._0_8_ = local_568;
            auVar3 = vdivps_avx(local_78,auVar11);
            local_158 = CONCAT44(fStack_3c4,local_3c8);
            uStack_150 = CONCAT44(fStack_3bc,fStack_3c0);
            local_6b8 = auVar4._0_8_;
            uStack_6b0 = auVar4._8_8_;
            local_278 = local_6b8;
            uVar18 = local_278;
            uStack_270 = uStack_6b0;
            uVar19 = uStack_270;
            local_278._0_4_ = auVar4._0_4_;
            local_278._4_4_ = auVar4._4_4_;
            uStack_270._0_4_ = auVar4._8_4_;
            uStack_270._4_4_ = auVar4._12_4_;
            local_168 = (float)local_278 * (float)local_1c8;
            fStack_164 = local_278._4_4_ * local_1c8._4_4_;
            fStack_160 = (float)uStack_270 * (float)uStack_1c0;
            fStack_15c = uStack_270._4_4_ * uStack_1c0._4_4_;
            auVar10._8_8_ = uStack_150;
            auVar10._0_8_ = local_158;
            auVar9._4_4_ = fStack_164;
            auVar9._0_4_ = local_168;
            auVar9._8_4_ = fStack_160;
            auVar9._12_4_ = fStack_15c;
            _local_388 = vsubps_avx(auVar10,auVar9);
            local_378._0_4_ = (float)uVar5;
            local_378._4_4_ = (float)((ulong)uVar5 >> 0x20);
            uStack_370._0_4_ = (float)uVar6;
            uStack_370._4_4_ = (float)((ulong)uVar6 >> 0x20);
            local_678 = CONCAT44(local_378._4_4_ + (float)local_388._4_4_,
                                 (float)local_378 + (float)local_388._0_4_);
            uStack_670 = CONCAT44(uStack_370._4_4_ + fStack_37c,(float)uStack_370 + fStack_380);
            local_178 = CONCAT44(fStack_3e4,local_3e8);
            uStack_170 = CONCAT44(fStack_3dc,fStack_3e0);
            local_6c8 = auVar3._0_8_;
            uStack_6c0 = auVar3._8_8_;
            local_298 = local_6c8;
            uVar16 = local_298;
            uStack_290 = uStack_6c0;
            uVar17 = uStack_290;
            local_298._0_4_ = auVar3._0_4_;
            local_298._4_4_ = auVar3._4_4_;
            uStack_290._0_4_ = auVar3._8_4_;
            uStack_290._4_4_ = auVar3._12_4_;
            local_188 = (float)local_298 * (float)local_1e8;
            fStack_184 = local_298._4_4_ * local_1e8._4_4_;
            fStack_180 = (float)uStack_290 * (float)uStack_1e0;
            fStack_17c = uStack_290._4_4_ * uStack_1e0._4_4_;
            auVar3._8_8_ = uStack_170;
            auVar3._0_8_ = local_178;
            auVar4._4_4_ = fStack_184;
            auVar4._0_4_ = local_188;
            auVar4._8_4_ = fStack_180;
            auVar4._12_4_ = fStack_17c;
            _local_3a8 = vsubps_avx(auVar3,auVar4);
            local_398._0_4_ = (float)uVar7;
            local_398._4_4_ = (float)((ulong)uVar7 >> 0x20);
            uStack_390._0_4_ = (float)uVar8;
            uStack_390._4_4_ = (float)((ulong)uVar8 >> 0x20);
            local_688 = CONCAT44(local_398._4_4_ + (float)local_3a8._4_4_,
                                 (float)local_398 + (float)local_3a8._0_4_);
            uStack_680 = CONCAT44(uStack_390._4_4_ + fStack_39c,(float)uStack_390 + fStack_3a0);
            local_a8 = local_678;
            uStack_a0 = uStack_670;
            *(undefined8 *)prVar29 = local_678;
            *(undefined8 *)(prVar25 + 10) = uStack_670;
            local_c8 = local_688;
            uStack_c0 = uStack_680;
            *(undefined8 *)prVar30 = local_688;
            *(undefined8 *)(prVar26 + 10) = uStack_680;
            local_2b8 = CONCAT44(fStack_3c4,local_3c8);
            uStack_2b0 = CONCAT44(fStack_3bc,fStack_3c0);
            local_2c8 = CONCAT44(fStack_3c4,local_3c8);
            uStack_2c0 = CONCAT44(fStack_3bc,fStack_3c0);
            local_3c8 = local_3c8 * local_3c8;
            fStack_3c4 = fStack_3c4 * fStack_3c4;
            fStack_3c0 = fStack_3c0 * fStack_3c0;
            fStack_3bc = fStack_3bc * fStack_3bc;
            local_658 = CONCAT44(local_338._4_4_ + fStack_3c4,(float)local_338 + local_3c8);
            uStack_650 = CONCAT44(uStack_330._4_4_ + fStack_3bc,(float)uStack_330 + fStack_3c0);
            local_2d8._4_4_ = fStack_3e4;
            local_2d8._0_4_ = local_3e8;
            local_2d8._8_4_ = fStack_3e0;
            local_2d8._12_4_ = fStack_3dc;
            local_2e8 = CONCAT44(fStack_3e4,local_3e8);
            uStack_2e0 = CONCAT44(fStack_3dc,fStack_3e0);
            local_3e8 = local_3e8 * local_3e8;
            fStack_3e4 = fStack_3e4 * fStack_3e4;
            fStack_3e0 = fStack_3e0 * fStack_3e0;
            fStack_3dc = fStack_3dc * fStack_3dc;
            local_668 = CONCAT44(local_358._4_4_ + fStack_3e4,(float)local_358 + local_3e8);
            uStack_660 = CONCAT44(uStack_350._4_4_ + fStack_3dc,(float)uStack_350 + fStack_3e0);
            local_e8 = local_658;
            uStack_e0 = uStack_650;
            *(undefined8 *)*pauVar27 = local_658;
            *(undefined8 *)(prVar25 + 6) = uStack_650;
            local_108 = local_668;
            uStack_100 = uStack_660;
            *(undefined8 *)*pauVar28 = local_668;
            *(undefined8 *)(prVar26 + 6) = uStack_660;
            local_418 = prVar30;
            local_410 = prVar29;
            local_408 = pauVar28;
            local_400 = pauVar27;
            local_3f8 = prVar26;
            local_3f0 = prVar25;
            local_398 = uVar7;
            uStack_390 = uVar8;
            local_378 = uVar5;
            uStack_370 = uVar6;
            local_358 = local_3d8;
            uStack_350 = uStack_3d0;
            local_338 = local_3b8;
            uStack_330 = uStack_3b0;
            local_298 = uVar16;
            uStack_290 = uVar17;
            local_278 = uVar18;
            uStack_270 = uVar19;
            local_228 = local_288;
            uStack_220 = uStack_280;
            local_208 = local_2a8;
            uStack_200 = uStack_2a0;
            local_1e8 = local_2a8;
            uStack_1e0 = uStack_2a0;
            local_1c8 = local_288;
            uStack_1c0 = uStack_280;
            local_1b8 = uVar20;
            uStack_1b0 = uVar21;
            local_f0 = pauVar28;
            local_d0 = pauVar27;
            local_b0 = prVar30;
            local_90 = prVar29;
            local_48 = local_3d8;
            uStack_40 = uStack_3d0;
            local_28 = local_3b8;
            uStack_20 = uStack_3b0;
            for (local_6d0 = 0; local_6d0 < 4; local_6d0 = local_6d0 + 1) {
              fVar2 = prVar29[local_6d0];
              iVar35 = -1;
              if (0.0 < fVar2) {
                iVar35 = 1;
              }
              if (*(float *)(in_RDI + 0x18) < (float)iVar35 * fVar2) {
                auVar4 = vfmadd213ss_fma(ZEXT416(*(uint *)(in_RDI + 0x18)),
                                         ZEXT416((uint)(float)iVar35),ZEXT416((uint)-fVar2));
                in_stack_fffffffffffff8ec = *(float *)(in_RDI + 0x14);
                dVar37 = std::sqrt((double)(ulong)*(uint *)((long)*pauVar27 + local_6d0 * 4));
                prVar25[local_6d0] =
                     auVar4._0_4_ /
                     ((in_stack_fffffffffffff8ec + SUB84(dVar37,0)) / *(float *)(in_RDI + 0x10) +
                     *(float *)(in_RDI + 0x1c));
              }
              else {
                prVar25[local_6d0] = 0.0;
              }
              fVar2 = prVar30[local_6d0];
              iVar35 = -1;
              if (0.0 < fVar2) {
                iVar35 = 1;
              }
              if (*(float *)(in_RDI + 0x18) < (float)iVar35 * fVar2) {
                auVar4 = vfmadd213ss_fma(ZEXT416(*(uint *)(in_RDI + 0x18)),
                                         ZEXT416((uint)(float)iVar35),ZEXT416((uint)-fVar2));
                in_stack_fffffffffffff8e8 = auVar4._0_4_;
                in_stack_fffffffffffff8e4 = *(float *)(in_RDI + 0x14);
                dVar37 = std::sqrt((double)(ulong)*(uint *)((long)*pauVar28 + local_6d0 * 4));
                prVar26[local_6d0] =
                     in_stack_fffffffffffff8e8 /
                     ((in_stack_fffffffffffff8e4 + SUB84(dVar37,0)) / *(float *)(in_RDI + 0x10) +
                     *(float *)(in_RDI + 0x1c));
              }
              else {
                prVar26[local_6d0] = 0.0;
              }
            }
          }
        }
        __gnu_cxx::
        __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
        ::operator++(&local_5a0);
      }
    }
    __gnu_cxx::
    __normal_iterator<const_xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
    ::operator++(&local_580);
  }
  return;
}

Assistant:

void FFMScore::calc_grad_ftrl(const SparseRow* row,
                              Model& model,
                              real_t pg,
                              real_t norm) {
  /*********************************************************
   *  linear term and bias term                            *
   *********************************************************/  
  real_t sqrt_norm = sqrt(norm);
  real_t *w = model.GetParameter_w();
  index_t num_feat = model.GetNumFeature();
  index_t num_field = model.GetNumField();
  for (SparseRow::const_iterator iter = row->begin();
       iter != row->end(); ++iter) {
    index_t feat_id = iter->feat_id;
    // To avoid unseen feature
    if (feat_id >= num_feat) continue;
    real_t &wl = w[feat_id*3];
    real_t &wlg = w[feat_id*3+1];
    real_t &wlz = w[feat_id*3+2];
    real_t g = lambda_2_*wl+pg*iter->feat_val*sqrt_norm; 
    real_t old_wlg = wlg;
    wlg += g*g;
    real_t sigma = (sqrt(wlg)-sqrt(old_wlg)) / alpha_;
    wlz += (g-sigma*wl);
    int sign = wlz > 0 ? 1:-1;
    if (sign*wlz <= lambda_1_) {
      wl = 0;
    } else {
      wl = (sign*lambda_1_-wlz) / 
           ((beta_ + sqrt(wlg)) / 
            alpha_ + lambda_2_);
    }
  }
  // bias
  w = model.GetParameter_b();
  real_t &wb = w[0];
  real_t &wbg = w[1];
  real_t &wbz = w[2];
  real_t g = pg;
  real_t old_wbg = wbg;
  wbg += g*g;
  real_t sigma = (sqrt(wbg)-sqrt(old_wbg)) / alpha_;
  wbz += (g-sigma*wb);
  int sign = wbz > 0 ? 1:-1;
  if (sign*wbz <= lambda_1_) {
    wb = 0;
  } else {
    wb = (sign*lambda_1_-wbz) / 
         ((beta_ + sqrt(wbg)) / 
          alpha_ + lambda_2_);
  }
  /*********************************************************
   *  latent factor                                        *
   *********************************************************/
  index_t align0 = 3 * model.get_aligned_k();
  index_t align1 = model.GetNumField() * align0;
  index_t align = kAlign * 3;
  w = model.GetParameter_v();
  __m128 XMMpg = _mm_set1_ps(pg);
  __m128 XMMalpha = _mm_set1_ps(alpha_);
  __m128 XMML2 = _mm_set1_ps(lambda_2_);
  for (SparseRow::const_iterator iter_i = row->begin();
       iter_i != row->end(); ++iter_i) {
    index_t j1 = iter_i->feat_id;
    index_t f1 = iter_i->field_id;
    // To avoid unseen feature
    if (j1 >= num_feat || f1 >= num_field) continue;
    real_t v1 = iter_i->feat_val;
    for (SparseRow::const_iterator iter_j = iter_i+1;
         iter_j != row->end(); ++iter_j) {
      index_t j2 = iter_j->feat_id;
      index_t f2 = iter_j->field_id;
      // To avoid unseen feature
      if (j2 >= num_feat || f2 >= num_field) continue;
      real_t v2 = iter_j->feat_val;
      real_t* w1_base = w + j1*align1 + f2*align0;
      real_t* w2_base = w + j2*align1 + f1*align0;
      __m128 XMMv = _mm_set1_ps(v1*v2*norm);
      __m128 XMMpgv = _mm_mul_ps(XMMv, XMMpg);
      for (index_t d = 0; d < align0; d += align) {
        real_t *w1 = w1_base + d;
        real_t *w2 = w2_base + d;
        real_t *wg1 = w1 + kAlign;
        real_t *wg2 = w2 + kAlign;
        real_t *z1 = w1 + kAlign * 2;
        real_t *z2 = w2 + kAlign * 2;
        __m128 XMMw1 = _mm_load_ps(w1);
        __m128 XMMw2 = _mm_load_ps(w2);
        __m128 XMMwg1 = _mm_load_ps(wg1);
        __m128 XMMwg2 = _mm_load_ps(wg2);
        __m128 XMMz1 = _mm_load_ps(z1);
        __m128 XMMz2 = _mm_load_ps(z2);
        __m128 XMMg1 = _mm_add_ps(
                       _mm_mul_ps(XMML2, XMMw1),
                       _mm_mul_ps(XMMpgv, XMMw2));
        __m128 XMMg2 = _mm_add_ps(
                       _mm_mul_ps(XMML2, XMMw2),
                       _mm_mul_ps(XMMpgv, XMMw1));
        __m128 XMMsigma1 = _mm_div_ps(
                           _mm_sub_ps(
                           _mm_sqrt_ps(
                           _mm_add_ps(XMMwg1,
                           _mm_mul_ps(XMMg1, XMMg1))),
                           _mm_sqrt_ps(XMMwg1)), XMMalpha);
        __m128 XMMsigma2 = _mm_div_ps(
                           _mm_sub_ps(
                           _mm_sqrt_ps(
                           _mm_add_ps(XMMwg2,
                           _mm_mul_ps(XMMg2, XMMg2))),
                           _mm_sqrt_ps(XMMwg2)), XMMalpha);
        XMMz1 = _mm_add_ps(XMMz1,
                _mm_sub_ps(XMMg1,
                _mm_mul_ps(XMMsigma1, XMMw1)));
        XMMz2 = _mm_add_ps(XMMz2,
                _mm_sub_ps(XMMg2,
                _mm_mul_ps(XMMsigma2, XMMw2)));
        _mm_store_ps(z1, XMMz1);
        _mm_store_ps(z2, XMMz2);
        XMMwg1 = _mm_add_ps(XMMwg1,
                 _mm_mul_ps(XMMg1, XMMg1));
        XMMwg2 = _mm_add_ps(XMMwg2,
                 _mm_mul_ps(XMMg2, XMMg2));
        _mm_store_ps(wg1, XMMwg1);
        _mm_store_ps(wg2, XMMwg2);
        // Update w. SSE may not faster
        for (size_t i = 0; i < kAlign; ++i) {
          // w1
          real_t z1_value = *(z1+i);
          int sign = z1_value > 0 ? 1 : -1;
          if (sign * z1_value <= lambda_1_) {
            *(w1+i) = 0;
          } else {
            *(w1+i) = (sign*lambda_1_-z1_value) / 
              ((beta_ + sqrt(*(wg1+i))) / alpha_ + lambda_2_);
          }
          // w2
          real_t z2_value = *(z2+i);
          sign = z2_value > 0 ? 1 : -1;
          if (sign * z2_value <= lambda_1_) {
            *(w2+i) = 0;
          } else {
            *(w2+i) = (sign*lambda_1_-z2_value) / 
              ((beta_ + sqrt(*(wg2+i))) / alpha_ + lambda_2_);
          }
        }
      }
    }
  }
}